

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O3

double av1_laplace_entropy(double q_step,double b,double zero_bin_ratio)

{
  double __x;
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (b <= 1e-07) {
    b = 1e-07;
  }
  dVar3 = (zero_bin_ratio * -0.5 * q_step) / b;
  if (dVar3 <= 700.0) {
    __x = 0.0;
    if (-700.0 <= dVar3) {
      __x = exp(dVar3);
    }
  }
  else {
    __x = 1.79769313486232e+308;
  }
  if (__x <= 1e-07) {
    __x = 1e-07;
  }
  dVar3 = av1_exponential_entropy(q_step,b);
  dVar1 = log2(1.0 - __x);
  dVar2 = log2(__x);
  return (dVar3 + 1.0) * __x + (dVar1 * -(1.0 - __x) - dVar2 * __x);
}

Assistant:

double av1_laplace_entropy(double q_step, double b, double zero_bin_ratio) {
  // zero bin's size is zero_bin_ratio * q_step
  // non-zero bin's size is q_step
  b = AOMMAX(b, TPL_EPSILON);
  double z = fmax(exp_bounded(-zero_bin_ratio / 2 * q_step / b), TPL_EPSILON);
  double h = av1_exponential_entropy(q_step, b);
  double r = -(1 - z) * log2(1 - z) - z * log2(z) + z * (h + 1);
  return r;
}